

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
::_container_insert<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
           *this,set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *column,
          Index pos,Dimension dim)

{
  reference puVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_unsigned_int>,_false,_false>,_bool>
  pVar2;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
  local_70;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> local_40;
  undefined1 local_38;
  undefined1 local_30 [20];
  ID_index pivot;
  Dimension dim_local;
  Index pos_local;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *column_local;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
  *this_local;
  
  local_30._16_4_ = dim;
  pivot = pos;
  _dim_local = (_Base_ptr)column;
  column_local = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)this;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::rbegin
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)local_30);
  puVar1 = std::reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_>::operator*
                     ((reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_> *)local_30);
  local_30._12_4_ = *puVar1;
  pVar2 = std::
          unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
          ::try_emplace<unsigned_int&>
                    ((unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                      *)(this + 0x128),(key_type *)(local_30 + 0xc),&pivot);
  local_40._M_cur =
       (__node_type *)
       pVar2.first.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
       _M_cur;
  local_38 = pVar2.second;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
  ::
  Intrusive_list_column<std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
            ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
              *)&local_70,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)_dim_local
             ,local_30._16_4_,*(Column_settings **)(this + 0x168));
  std::
  unordered_map<unsigned_int,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>>>>
  ::
  try_emplace<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>>
            ((unordered_map<unsigned_int,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>>>>
              *)(this + 0xf0),&pivot,&local_70);
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>_>
  ::~Intrusive_list_column(&local_70);
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_container_insert(const Container& column, Index pos, Dimension dim)
{
  ID_index pivot;
  if constexpr (Master_matrix::Option_list::is_z2) {
    pivot = *(column.rbegin());
  } else {
    pivot = column.rbegin()->first;
  }
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    pivotToColumnIndex_.try_emplace(pivot, pos);
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.try_emplace(pos, Column(pos, column, dim, RA_opt::rows_, colSettings_));
    } else {
      matrix_.try_emplace(pos, Column(column, dim, colSettings_));
    }
  } else {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.emplace_back(pos, column, dim, RA_opt::rows_, colSettings_);
    } else {
      matrix_.emplace_back(column, dim, colSettings_);
    }
    pivotToColumnIndex_[pivot] = pos;
  }
}